

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapValueRef::DeleteData(MapValueRef *this)

{
  string *this_00;
  long *in_RDI;
  
  switch((int)in_RDI[1]) {
  case 1:
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete((void *)*in_RDI);
    }
    break;
  case 2:
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete((void *)*in_RDI);
    }
    break;
  case 3:
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete((void *)*in_RDI);
    }
    break;
  case 4:
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete((void *)*in_RDI);
    }
    break;
  case 5:
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete((void *)*in_RDI);
    }
    break;
  case 6:
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete((void *)*in_RDI);
    }
    break;
  case 7:
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete((void *)*in_RDI);
    }
    break;
  case 8:
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete((void *)*in_RDI);
    }
    break;
  case 9:
    this_00 = (string *)*in_RDI;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00);
      operator_delete(this_00);
    }
    break;
  case 10:
    if ((long *)*in_RDI != (long *)0x0) {
      (**(code **)(*(long *)*in_RDI + 8))();
    }
  }
  return;
}

Assistant:

void DeleteData() {
    switch (type_) {
#define HANDLE_TYPE(CPPTYPE, TYPE)           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: { \
    delete reinterpret_cast<TYPE*>(data_);   \
    break;                                   \
  }
      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, std::string);
      HANDLE_TYPE(ENUM, int32);
      HANDLE_TYPE(MESSAGE, Message);
#undef HANDLE_TYPE
    }
  }